

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcFaceSurface,_2UL>::Construct
                   (DB *db,LIST *params)

{
  IfcFaceSurface *in;
  
  in = (IfcFaceSurface *)operator_new(0x98);
  *(undefined ***)&in->field_0x80 = &PTR__Object_00816a50;
  *(undefined8 *)&in->field_0x88 = 0;
  *(char **)&in->field_0x90 = "IfcFaceSurface";
  Assimp::IFC::Schema_2x3::IfcFace::IfcFace((IfcFace *)in,&PTR_construction_vtable_24__00871ac0);
  *(undefined8 *)&(in->super_IfcFace).field_0x50 = 0;
  *(undefined8 *)&(in->super_IfcFace).field_0x58 = 0;
  (in->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
  super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcFaceSurface_00871a08;
  *(undefined ***)&in->field_0x80 = &PTR__IfcFaceSurface_00871aa8;
  *(undefined ***)
   &(in->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x10 =
       &PTR__IfcFaceSurface_00871a30;
  *(undefined ***)
   &(in->super_IfcFace).super_IfcTopologicalRepresentationItem.super_IfcRepresentationItem.
    super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.field_0x20 =
       &PTR__IfcFaceSurface_00871a58;
  *(undefined ***)&(in->super_IfcFace).field_0x48 = &PTR__IfcFaceSurface_00871a80;
  (in->SameSense)._M_dataplus._M_p = (pointer)&(in->SameSense).field_2;
  (in->SameSense)._M_string_length = 0;
  (in->SameSense).field_2._M_local_buf[0] = '\0';
  GenericFill<Assimp::IFC::Schema_2x3::IfcFaceSurface>(db,params,in);
  return (Object *)
         ((long)&(in->super_IfcFace).super_IfcTopologicalRepresentationItem.
                 super_IfcRepresentationItem.
                 super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
                 _vptr_ObjectHelper +
         (long)(in->super_IfcFace).super_IfcTopologicalRepresentationItem.
               super_IfcRepresentationItem.
               super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcRepresentationItem,_0UL>.
               _vptr_ObjectHelper[-3]);
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }